

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void print_node2(Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char local_26 [6];
  Abc_Obj_t *pAStack_20;
  char m [6];
  Abc_Obj_t *pNext;
  int i;
  Abc_Obj_t *pObj_local;
  
  local_26[0] = '\0';
  if ((*(uint *)&pObj->field_0x14 >> 4 & 1) != 0) {
    strcat(local_26,"A");
  }
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) != 0) {
    strcat(local_26,"B");
  }
  if ((*(uint *)&pObj->field_0x14 >> 6 & 1) != 0) {
    strcat(local_26,"C");
  }
  uVar1 = Abc_ObjId(pObj);
  uVar2 = Abc_ObjType(pObj);
  printf("node %d type=%d %s fanouts {",(ulong)uVar1,(ulong)uVar2,local_26);
  for (pNext._4_4_ = 0; iVar3 = Abc_ObjFanoutNum(pObj), pNext._4_4_ < iVar3;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanout(pObj,pNext._4_4_);
    uVar1 = Abc_ObjId(pAStack_20);
    printf("%d ,",(ulong)uVar1);
  }
  printf("} fanins {");
  for (pNext._4_4_ = 0; iVar3 = Abc_ObjFaninNum(pObj), pNext._4_4_ < iVar3;
      pNext._4_4_ = pNext._4_4_ + 1) {
    pAStack_20 = Abc_ObjFanin(pObj,pNext._4_4_);
    uVar1 = Abc_ObjId(pAStack_20);
    printf("%d ,",(ulong)uVar1);
  }
  printf("} ");
  return;
}

Assistant:

void
print_node2(Abc_Obj_t *pObj) {
  int i;
  Abc_Obj_t * pNext;
  char m[6];

  m[0] = 0;
  if (pObj->fMarkA)
    strcat(m, "A");
  if (pObj->fMarkB)
    strcat(m, "B");
  if (pObj->fMarkC)
    strcat(m, "C");

  printf("node %d type=%d %s fanouts {", Abc_ObjId(pObj), Abc_ObjType(pObj), m);
  Abc_ObjForEachFanout( pObj, pNext, i )
    printf("%d ,", Abc_ObjId(pNext));
  printf("} fanins {");
  Abc_ObjForEachFanin( pObj, pNext, i )
    printf("%d ,", Abc_ObjId(pNext));
  printf("} ");
}